

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t internal_exr_parse_header(_internal_exr_context *ctxt)

{
  _internal_exr_part *p_Var1;
  uint8_t uVar2;
  exr_result_t eVar3;
  int iVar4;
  _internal_exr_context *in_RDI;
  exr_result_t rv;
  uint8_t next_byte;
  uint64_t initpos;
  uint32_t flags;
  _internal_exr_part *curpart;
  _internal_exr_seq_scratch scratch;
  _internal_exr_seq_scratch *in_stack_000001d0;
  uint8_t in_stack_000001df;
  _internal_exr_part *in_stack_000001e0;
  _internal_exr_context *in_stack_000001e8;
  uint in_stack_ffffffffffffff9c;
  _internal_exr_part *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint64_t *in_stack_ffffffffffffffb8;
  _internal_exr_part **in_stack_ffffffffffffffc0;
  _internal_exr_context *in_stack_ffffffffffffffc8;
  code *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->silent_header != '\0') {
    in_RDI->standard_error = silent_standard_error;
    in_RDI->report_error = silent_error;
    in_RDI->print_error = silent_print_error;
  }
  eVar3 = read_magic_and_flags
                    (in_stack_ffffffffffffffc8,(uint32_t *)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8);
  if (eVar3 == 0) {
    eVar3 = priv_init_scratch((_internal_exr_context *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0,
                              (ulong)in_stack_ffffffffffffff9c << 0x20);
    if (eVar3 == 0) {
      p_Var1 = *in_RDI->parts;
      if (p_Var1 == (_internal_exr_part *)0x0) {
        eVar3 = (*in_RDI->report_error)(in_RDI,3,"Error during file initialization");
        priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
        eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
      }
      else {
        in_RDI->is_singlepart_tiled = (in_stack_ffffffffffffffac & 0x200) != 0;
        if (in_RDI->strict_header == '\0') {
          in_RDI->max_name_length = 0xff;
        }
        else {
          uVar2 = '\x1f';
          if ((in_stack_ffffffffffffffac & 0x400) != 0) {
            uVar2 = 0xff;
          }
          in_RDI->max_name_length = uVar2;
        }
        in_RDI->has_nonimage_data = (in_stack_ffffffffffffffac & 0x800) != 0;
        in_RDI->is_multipart = (in_stack_ffffffffffffffac & 0x1000) != 0;
        if (in_RDI->is_singlepart_tiled == '\0') {
          p_Var1->storage_mode = EXR_STORAGE_SCANLINE;
        }
        else {
          if ((in_RDI->has_nonimage_data != '\0') || (in_RDI->is_multipart != '\0')) {
            if (in_RDI->strict_header != '\0') {
              eVar3 = (*in_RDI->print_error)
                                (in_RDI,6,
                                 "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)"
                                 ,(ulong)in_RDI->has_nonimage_data,(ulong)in_RDI->is_multipart);
              priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
              eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
              return eVar3;
            }
            in_RDI->is_singlepart_tiled = '\0';
          }
          p_Var1->storage_mode = EXR_STORAGE_TILED;
        }
        do {
          iVar4 = (*local_28)(&stack0xffffffffffffffb8,&stack0xffffffffffffff9f,1);
          if (iVar4 != 0) {
            eVar3 = (*in_RDI->report_error)(in_RDI,6,"Unable to extract header byte");
            priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
            eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
            return eVar3;
          }
          iVar4 = 0;
          if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') {
            eVar3 = internal_exr_validate_read_part
                              ((_internal_exr_context *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa0);
            if (eVar3 != 0) {
              priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
              eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
              return eVar3;
            }
            if (in_RDI->is_multipart == '\0') {
              iVar4 = 0;
              break;
            }
            iVar4 = (*local_28)(&stack0xffffffffffffffb8,&stack0xffffffffffffff9f,1);
            if (iVar4 != 0) {
              eVar3 = (*in_RDI->report_error)(in_RDI,6,"Unable to go to next part definition");
              priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
              eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
              return eVar3;
            }
            if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') {
              iVar4 = 0;
              break;
            }
            iVar4 = internal_exr_add_part
                              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                               (int *)in_stack_ffffffffffffffb8);
          }
          if (iVar4 == 0) {
            iVar4 = pull_attr(in_stack_000001e8,in_stack_000001e0,in_stack_000001df,
                              in_stack_000001d0);
          }
        } while ((iVar4 == 0) || (in_RDI->strict_header == '\0'));
        if (iVar4 == 0) {
          iVar4 = update_chunk_offsets
                            ((_internal_exr_context *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (_internal_exr_seq_scratch *)in_RDI);
        }
        priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
        eVar3 = internal_exr_context_restore_handlers(in_RDI,iVar4);
      }
    }
    else {
      priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_ffffffffffffffa0);
      eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
    }
  }
  else {
    eVar3 = internal_exr_context_restore_handlers(in_RDI,eVar3);
  }
  return eVar3;
}

Assistant:

exr_result_t
internal_exr_parse_header (struct _internal_exr_context* ctxt)
{
    struct _internal_exr_seq_scratch scratch;
    struct _internal_exr_part*       curpart;
    uint32_t                         flags;
    uint64_t                         initpos;
    uint8_t                          next_byte;
    exr_result_t                     rv = EXR_ERR_UNKNOWN;

    if (ctxt->silent_header)
    {
        ctxt->standard_error = &silent_standard_error;
        ctxt->report_error   = &silent_error;
        ctxt->print_error    = &silent_print_error;
    }
    rv = read_magic_and_flags (ctxt, &flags, &initpos);
    if (rv != EXR_ERR_SUCCESS)
        return internal_exr_context_restore_handlers (ctxt, rv);

    rv = priv_init_scratch (ctxt, &scratch, initpos);
    if (rv != EXR_ERR_SUCCESS)
    {
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    curpart = ctxt->parts[0];
    if (!curpart)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Error during file initialization");
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    ctxt->is_singlepart_tiled = (flags & EXR_TILED_FLAG) ? 1 : 0;
    if (ctxt->strict_header)
    {
        ctxt->max_name_length = (flags & EXR_LONG_NAMES_FLAG)
                                    ? EXR_LONGNAME_MAXLEN
                                    : EXR_SHORTNAME_MAXLEN;
    }
    else
    {
        ctxt->max_name_length = EXR_LONGNAME_MAXLEN;
    }
    ctxt->has_nonimage_data = (flags & EXR_NON_IMAGE_FLAG) ? 1 : 0;
    ctxt->is_multipart      = (flags & EXR_MULTI_PART_FLAG) ? 1 : 0;
    if (ctxt->is_singlepart_tiled)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            if (ctxt->strict_header)
            {
                rv = ctxt->print_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)",
                    (int) ctxt->has_nonimage_data,
                    (int) ctxt->is_multipart);
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }
            else
            {
                // assume multipart for now
                ctxt->is_singlepart_tiled = 0;
            }
        }
        curpart->storage_mode = EXR_STORAGE_TILED;
    }
    else
        curpart->storage_mode = EXR_STORAGE_SCANLINE;

    do
    {
        rv = scratch.sequential_read (&scratch, &next_byte, 1);
        if (rv != EXR_ERR_SUCCESS)
        {
            rv = ctxt->report_error (
                ctxt, EXR_ERR_FILE_BAD_HEADER, "Unable to extract header byte");
            priv_destroy_scratch (&scratch);
            return internal_exr_context_restore_handlers (ctxt, rv);
        }

        if (next_byte == '\0')
        {
            rv = internal_exr_validate_read_part (ctxt, curpart);
            if (rv != EXR_ERR_SUCCESS)
            {
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (!ctxt->is_multipart)
            {
                /* got a terminal mark, not multipart, so finished */
                break;
            }

            rv = scratch.sequential_read (&scratch, &next_byte, 1);
            if (rv != EXR_ERR_SUCCESS)
            {
                rv = ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Unable to go to next part definition");
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (next_byte == '\0')
            {
                /* got a second terminator, finished with the
                 * headers, can read chunk offsets next */
                break;
            }

            rv = internal_exr_add_part (ctxt, &curpart, NULL);
        }

        if (rv == EXR_ERR_SUCCESS)
            rv = pull_attr (ctxt, curpart, next_byte, &scratch);
        if (rv != EXR_ERR_SUCCESS)
        {
            if (ctxt->strict_header) { break; }
            rv = EXR_ERR_SUCCESS;
        }
    } while (1);

    if (rv == EXR_ERR_SUCCESS) { rv = update_chunk_offsets (ctxt, &scratch); }

    priv_destroy_scratch (&scratch);
    return internal_exr_context_restore_handlers (ctxt, rv);
}